

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

int Abc_DesFindTopLevelModels(Abc_Des_t *p)

{
  int iVar1;
  void *pvVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj_00;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkBox;
  Abc_Ntk_t *pNtk;
  Abc_Des_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vModules);
  if (0 < iVar1) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pvVar2 = Vec_PtrEntry(p->vModules,local_2c);
      *(undefined4 *)((long)pvVar2 + 0xc0) = 0;
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,local_2c);
      for (local_30 = 0; iVar1 = Vec_PtrSize(pNtk_00->vBoxes), local_30 < iVar1;
          local_30 = local_30 + 1) {
        pObj_00 = Abc_NtkBox(pNtk_00,local_30);
        iVar1 = Abc_ObjIsLatch(pObj_00);
        if ((iVar1 == 0) && ((pObj_00->field_5).pData != (void *)0x0)) {
          *(undefined4 *)((long)(pObj_00->field_5).pData + 0xc0) = 1;
        }
      }
    }
    Vec_PtrClear(p->vTops);
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pvVar2 = Vec_PtrEntry(p->vModules,local_2c);
      if (*(int *)((long)pvVar2 + 0xc0) == 0) {
        Vec_PtrPush(p->vTops,pvVar2);
      }
      else {
        *(undefined4 *)((long)pvVar2 + 0xc0) = 0;
      }
    }
    iVar1 = Vec_PtrSize(p->vTops);
    return iVar1;
  }
  __assert_fail("Vec_PtrSize( p->vModules ) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                ,0x12a,"int Abc_DesFindTopLevelModels(Abc_Des_t *)");
}

Assistant:

int Abc_DesFindTopLevelModels( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Vec_PtrSize( p->vModules ) > 0 );
    // clear the models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    // mark all the models reachable from other models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        Abc_NtkForEachBox( pNtk, pObj, k )
        {
            if ( Abc_ObjIsLatch(pObj) )
                continue;
            if ( pObj->pData == NULL )
                continue;
            pNtkBox = (Abc_Ntk_t *)pObj->pData;
            pNtkBox->fHieVisited = 1;
        }
    }
    // collect the models that are not marked
    Vec_PtrClear( p->vTops );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        if ( pNtk->fHieVisited == 0 )
            Vec_PtrPush( p->vTops, pNtk );
        else
            pNtk->fHieVisited = 0;
    }
    return Vec_PtrSize( p->vTops );
}